

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Alt_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  size_t n;
  char *pcVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  void *struct_base;
  flatcc_builder_ref_t *pfVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar13;
  ulong uVar12;
  byte *pbVar14;
  size_t __n;
  long lVar15;
  byte bVar18;
  ulong uVar16;
  ulong *puVar17;
  uint uVar19;
  byte bVar22;
  flatcc_builder_t *pfVar20;
  ulong uVar21;
  uint uVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  ulong *puVar27;
  bool bVar28;
  int more;
  int local_94;
  flatcc_builder_ref_t ref;
  int more_1;
  flatcc_builder_ref_t *local_88;
  float val;
  flatcc_builder_ref_t ref_1;
  ulong local_70;
  float *local_68;
  float *local_60;
  size_t h_unions;
  float *local_50;
  float *local_48;
  float *local_40;
  char *base;
  
  *result = 0;
  iVar1 = flatcc_builder_start_table(ctx->ctx,9);
  if ((iVar1 != 0) ||
     (pcVar3 = flatcc_json_parser_prepare_unions(ctx,buf,end,1,&h_unions), pcVar3 == end))
  goto LAB_001146a9;
  if ((buf == end) || (*buf != '{')) {
    more = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    goto LAB_0011473e;
  }
  puVar27 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar27 < 2) {
LAB_0011477b:
    puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
  }
  else if ((char)(byte)*puVar27 < '!') {
    if (((byte)*puVar27 != 0x20) || (buf[2] < '!')) goto LAB_0011477b;
    puVar27 = (ulong *)(buf + 2);
  }
  if ((puVar27 != (ulong *)end) && ((byte)*puVar27 == 0x7d)) {
    more = 0;
    buf = (char *)((long)puVar27 + 1);
    if ((long)end - (long)buf < 2) {
LAB_001171e5:
      puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,buf,end);
      buf = (char *)puVar27;
      pfVar8 = result;
      if (more != 0) goto LAB_001147e6;
    }
    else if (*buf < '!') {
      if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!')) goto LAB_001171e5;
      buf = (char *)((long)puVar27 + 2);
    }
LAB_0011473e:
    if (ctx->error == 0) {
      buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
      fVar2 = flatcc_builder_end_table(ctx->ctx);
      *result = fVar2;
      if (fVar2 != 0) {
        return (char *)(ulong *)buf;
      }
    }
LAB_001146a9:
    pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    return pcVar3;
  }
  more = 1;
  pfVar8 = result;
LAB_001147e6:
  local_88 = pfVar8;
  if (puVar27 != (ulong *)end) {
    if ((byte)*puVar27 == 0x2e) {
      puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar27,end,5);
    }
    else if ((byte)*puVar27 == 0x22) {
      puVar27 = (ulong *)((long)puVar27 + 1);
      ctx->unquoted = 0;
    }
    else {
      ctx->unquoted = 1;
    }
  }
  uVar9 = (long)end - (long)puVar27;
  buf = (char *)puVar27;
  if (uVar9 < 8) {
    uVar5 = 0;
    uVar6 = 0;
    uVar12 = 0;
    uVar16 = 0;
    uVar21 = 0;
    uVar26 = 0;
    switch(uVar9) {
    case 7:
      uVar5 = (long)(char)*(byte *)((long)puVar27 + 6) << 8;
    case 6:
      uVar6 = (long)(char)*(byte *)((long)puVar27 + 5) << 0x10 | uVar5;
    case 5:
      uVar12 = (long)(char)*(byte *)((long)puVar27 + 4) << 0x18 | uVar6;
    case 4:
      uVar16 = (long)(char)*(byte *)((long)puVar27 + 3) << 0x20 | uVar12;
    case 3:
      uVar21 = (long)(char)*(byte *)((long)puVar27 + 2) << 0x28 | uVar16;
    case 2:
      uVar26 = (long)(char)*(byte *)((long)puVar27 + 1) << 0x30 | uVar21;
    case 1:
      uVar26 = (ulong)(byte)*puVar27 << 0x38 | uVar26;
      goto LAB_001148b9;
    }
    goto switchD_00114b15_default;
  }
  uVar6 = *puVar27;
  uVar26 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
LAB_001148b9:
  if (uVar26 < 0x6d756c74696b0000) {
    if (uVar26 < 0x6d616e79616e7900) {
      if (uVar26 != 0x66697865645f6172) goto switchD_00114b15_default;
      puVar7 = puVar27 + 1;
      uVar9 = (long)end - (long)puVar7;
      buf = (char *)puVar7;
      if (uVar9 < 8) {
        uVar19 = 0;
        uVar23 = 0;
        uVar10 = 0;
        switch(uVar9) {
        case 7:
        case 6:
        case 5:
        case 4:
          uVar19 = (uint)(char)*(byte *)((long)puVar27 + 0xb);
        case 3:
          uVar23 = (uint)((ulong)((long)(char)*(byte *)((long)puVar27 + 10) << 0x28) >> 0x20) |
                   uVar19;
        case 2:
          uVar10 = (uint)((ulong)((long)(char)*(byte *)((long)puVar27 + 9) << 0x30) >> 0x20) |
                   uVar23;
        case 1:
          uVar10 = (uint)(((ulong)(byte)*puVar7 << 0x38) >> 0x20) | uVar10;
          break;
        default:
          goto switchD_00114b15_default;
        }
      }
      else {
        uVar6 = *puVar7;
        uVar10 = (uint)(uVar6 >> 8) & 0xff00 | (uint)(((uVar6 & 0xff00) << 0x28) >> 0x20) |
                 (uint)((uVar6 << 0x38) >> 0x20);
      }
      if ((uVar10 >> 8 != 0x726179) || ((long)uVar9 < 4)) goto switchD_00114b15_default;
      bVar25 = *(byte *)((long)puVar27 + 0xb);
      if (ctx->unquoted != 0) {
        if ((char)bVar25 < '!' || bVar25 == 0x3a) {
          pbVar14 = (byte *)((long)puVar27 + 0xb);
          ctx->unquoted = 0;
          goto LAB_00114f0e;
        }
        goto switchD_00114b15_default;
      }
      if (bVar25 != 0x22) goto switchD_00114b15_default;
      pbVar14 = (byte *)((long)puVar27 + 0xc);
LAB_00114f0e:
      if ((long)end - (long)pbVar14 < 2) {
LAB_001150c2:
        pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
      }
      else if ((char)*pbVar14 < '!') {
        if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_001150c2;
        pbVar14 = pbVar14 + 1;
      }
      if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
        buf = flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
      }
      else {
        buf = (char *)(pbVar14 + 1);
        if ((long)end - (long)buf < 2) {
LAB_00115d90:
          buf = flatcc_json_parser_space_ext(ctx,buf,end);
        }
        else if ((char)(byte)*(ulong *)buf < '!') {
          if (((byte)*(ulong *)buf != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_00115d90;
          buf = (char *)(pbVar14 + 2);
        }
      }
      if (puVar7 == (ulong *)buf) goto switchD_00114b15_default;
      pfVar4 = (float *)flatcc_builder_table_add(ctx->ctx,8,0x7c,4);
      if (pfVar4 != (float *)0x0) {
        if ((buf != end) && ((byte)*(ulong *)buf == 0x7b)) {
          puVar27 = (ulong *)((long)buf + 1);
          local_68 = pfVar4;
          if ((long)end - (long)puVar27 < 2) {
LAB_00115eeb:
            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
          }
          else if ((char)*(byte *)puVar27 < '!') {
            if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
            goto LAB_00115eeb;
            puVar27 = (ulong *)((long)buf + 2);
          }
          if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x7d)) {
            local_94 = 1;
            local_50 = local_68 + 0x1b;
            base = (char *)(local_68 + 0x1d);
            local_40 = local_68 + 0x10;
            local_48 = local_68 + 0x1a;
            buf = (char *)puVar27;
            do {
              if (buf != end) {
                if ((byte)*(ulong *)buf == 0x2e) {
                  buf = flatcc_json_parser_set_error(ctx,buf,end,5);
                }
                else if ((byte)*(ulong *)buf == 0x22) {
                  buf = (char *)((long)buf + 1);
                  ctx->unquoted = 0;
                }
                else {
                  ctx->unquoted = 1;
                }
              }
              uVar9 = (long)end - (long)buf;
              puVar27 = (ulong *)buf;
              if (uVar9 < 8) {
                uVar12 = 0;
                uVar6 = 0;
                uVar16 = 0;
                uVar21 = 0;
                uVar26 = 0;
                uVar5 = 0;
                switch(uVar9) {
                case 7:
                  uVar12 = (long)(char)*(byte *)((long)buf + 6) << 8;
                case 6:
                  uVar6 = (long)(char)*(byte *)((long)buf + 5) << 0x10 | uVar12;
                case 5:
                  uVar16 = (long)(char)*(byte *)((long)buf + 4) << 0x18 | uVar6;
                case 4:
                  uVar21 = (long)(char)*(byte *)((long)buf + 3) << 0x20 | uVar16;
                case 3:
                  uVar26 = (long)(char)*(byte *)((long)buf + 2) << 0x28 | uVar21;
                case 2:
                  uVar5 = (long)(char)*(byte *)((long)buf + 1) << 0x30 | uVar26;
                case 1:
                  uVar5 = (ulong)(byte)*(ulong *)buf << 0x38 | uVar5;
                  goto LAB_00116039;
                }
switchD_00115fe6_default:
                puVar7 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar27,end);
              }
              else {
                uVar6 = *(ulong *)buf;
                uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                        (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                        (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                        (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
LAB_00116039:
                if (uVar5 < 0x666f6f0000000000) {
                  if ((uVar5 & 0x7fffff0000000000) == 0x6261720000000000) {
                    if (3 < (long)uVar9) {
                      bVar25 = *(byte *)((long)buf + 3);
                      if (ctx->unquoted == 0) {
                        if (bVar25 == 0x22) {
                          pbVar14 = (byte *)((long)buf + 4);
                          goto LAB_00116270;
                        }
                      }
                      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                        pbVar14 = (byte *)((long)buf + 3);
                        ctx->unquoted = 0;
LAB_00116270:
                        if ((long)end - (long)pbVar14 < 2) {
LAB_001162e5:
                          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                        }
                        else if ((char)*pbVar14 < '!') {
                          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_001162e5;
                          pbVar14 = pbVar14 + 1;
                        }
                        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4)
                          ;
                        }
                        else {
                          puVar27 = (ulong *)(pbVar14 + 1);
                          if ((long)end - (long)puVar27 < 2) {
LAB_00116814:
                            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end)
                            ;
                          }
                          else {
                            result = local_88;
                            if ((char)(byte)*puVar27 < '!') {
                              if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                              goto LAB_00116814;
                              puVar27 = (ulong *)(pbVar14 + 2);
                            }
                          }
                        }
                      }
                    }
                    if ((ulong *)buf == puVar27) goto switchD_00115fe6_default;
                    if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5b)) {
                      local_94 = 0;
                      puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar27,end,0x16);
                      goto LAB_00116876;
                    }
                    puVar7 = (ulong *)((long)puVar27 + 1);
                    if ((long)end - (long)puVar7 < 2) {
LAB_0011688c:
                      puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                    }
                    else if ((char)*(byte *)puVar7 < '!') {
                      if ((*(byte *)puVar7 != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!'))
                      goto LAB_0011688c;
                      puVar7 = (ulong *)((long)puVar27 + 2);
                    }
                    if ((puVar7 == (ulong *)end) || ((byte)*puVar7 != 0x5d)) {
                      local_94 = 1;
LAB_001168dd:
                      lVar15 = 10;
                      pfVar4 = local_40;
                      do {
                        _val = 0;
                        local_70 = local_70 & 0xffffffff00000000;
                        more_1 = 0;
                        buf = (char *)puVar7;
                        if ((puVar7 != (ulong *)end) &&
                           (buf = flatcc_json_parser_integer
                                            (ctx,(char *)puVar7,end,(int *)&local_70,
                                             (uint64_t *)&val), (ulong *)buf != puVar7)) {
                          if ((int)local_70 == 0) {
                            uVar9 = _val;
                            if (_val >> 0x1f == 0) goto LAB_00116966;
                            iVar1 = 7;
                          }
                          else {
                            if (_val < 0x80000001) {
                              uVar9 = -_val;
LAB_00116966:
                              more_1 = (int)uVar9;
                              goto LAB_0011696a;
                            }
                            iVar1 = 8;
                          }
                          buf = flatcc_json_parser_set_error(ctx,buf,end,iVar1);
                        }
LAB_0011696a:
                        if ((puVar7 == (ulong *)buf) &&
                           ((buf = flatcc_json_parser_symbolic_int32
                                             (ctx,buf,end,
                                              (flatcc_json_parser_integral_symbol_f **)
                                              MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_217
                                              ,&more_1), (ulong *)buf == puVar7 || (buf == end))))
                        goto LAB_00117041;
                        if (lVar15 == 0) {
                          if ((ctx->flags & 8) == 0) goto LAB_0011705b;
                          lVar15 = 0;
                        }
                        else {
                          *pfVar4 = (float)more_1;
                          lVar15 = lVar15 + -1;
                          pfVar4 = pfVar4 + 1;
                        }
                        puVar7 = (ulong *)flatcc_json_parser_array_end(ctx,buf,end,&local_94);
                      } while (local_94 != 0);
                      goto LAB_001169e9;
                    }
                    local_94 = 0;
                    puVar27 = (ulong *)((long)puVar7 + 1);
                    if ((long)end - (long)puVar27 < 2) {
LAB_00116a63:
                      puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
                    }
                    else {
                      result = local_88;
                      if ((char)*(byte *)puVar27 < '!') {
                        if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)puVar7 + 2) < '!'))
                        goto LAB_00116a63;
                        puVar27 = (ulong *)((long)puVar7 + 2);
                      }
                    }
LAB_00116876:
                    puVar7 = puVar27;
                    if (local_94 != 0) goto LAB_001168dd;
                    lVar15 = 10;
                    pfVar4 = local_40;
LAB_001169f2:
                    buf = (char *)puVar7;
                    if ((ctx->flags & 0x10) != 0) goto LAB_001170c2;
                    __n = lVar15 << 2;
                  }
                  else {
                    if ((uVar5 & 0x7fffff0000000000) != 0x636f6c0000000000)
                    goto switchD_00115fe6_default;
                    if (3 < (long)uVar9) {
                      bVar25 = *(byte *)((long)buf + 3);
                      if (ctx->unquoted == 0) {
                        if (bVar25 == 0x22) {
                          pbVar14 = (byte *)((long)buf + 4);
                          goto LAB_00116243;
                        }
                      }
                      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                        pbVar14 = (byte *)((long)buf + 3);
                        ctx->unquoted = 0;
LAB_00116243:
                        if ((long)end - (long)pbVar14 < 2) {
LAB_0011628e:
                          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                        }
                        else if ((char)*pbVar14 < '!') {
                          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_0011628e;
                          pbVar14 = pbVar14 + 1;
                        }
                        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4)
                          ;
                        }
                        else {
                          puVar27 = (ulong *)(pbVar14 + 1);
                          if ((long)end - (long)puVar27 < 2) {
LAB_00116612:
                            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end)
                            ;
                          }
                          else {
                            result = local_88;
                            if ((char)(byte)*puVar27 < '!') {
                              if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                              goto LAB_00116612;
                              puVar27 = (ulong *)(pbVar14 + 2);
                            }
                          }
                        }
                      }
                    }
                    if ((ulong *)buf == puVar27) goto switchD_00115fe6_default;
                    if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5b)) {
                      local_94 = 0;
                      puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar27,end,0x16);
                      goto LAB_00116674;
                    }
                    puVar17 = (ulong *)((long)puVar27 + 1);
                    if ((long)end - (long)puVar17 < 2) {
LAB_0011668a:
                      puVar17 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar17,end);
                    }
                    else if ((char)*(byte *)puVar17 < '!') {
                      if ((*(byte *)puVar17 != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!'))
                      goto LAB_0011668a;
                      puVar17 = (ulong *)((long)puVar27 + 2);
                    }
                    if ((puVar17 == (ulong *)end) || ((byte)*puVar17 != 0x5d)) {
                      local_94 = 1;
                      puVar7 = puVar17;
LAB_001166db:
                      __n = 3;
                      pfVar4 = local_48;
                      do {
                        _val = 0;
                        local_70 = local_70 & 0xffffffff00000000;
                        more_1 = more_1 & 0xffffff00;
                        buf = (char *)puVar7;
                        if ((puVar7 != (ulong *)end) &&
                           (buf = flatcc_json_parser_integer
                                            (ctx,(char *)puVar7,end,(int *)&local_70,
                                             (uint64_t *)&val), (ulong *)buf != puVar7)) {
                          if ((int)local_70 == 0) {
                            uVar9 = _val;
                            if (_val < 0x80) goto LAB_00116766;
                            iVar1 = 7;
                          }
                          else {
                            if (_val < 0x81) {
                              uVar9 = -_val;
LAB_00116766:
                              more_1 = CONCAT31(more_1._1_3_,(char)uVar9);
                              goto LAB_0011676a;
                            }
                            iVar1 = 8;
                          }
                          buf = flatcc_json_parser_set_error(ctx,buf,end,iVar1);
                        }
LAB_0011676a:
                        if ((puVar7 == (ulong *)buf) &&
                           ((buf = flatcc_json_parser_symbolic_int8
                                             (ctx,buf,end,
                                              (flatcc_json_parser_integral_symbol_f **)
                                              MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers
                                              ,(int8_t *)&more_1), (ulong *)buf == puVar7 ||
                            (buf == end)))) goto LAB_00117041;
                        if (__n == 0) {
                          if ((ctx->flags & 8) == 0) goto LAB_0011705b;
                          __n = 0;
                        }
                        else {
                          *(undefined1 *)pfVar4 = (undefined1)more_1;
                          __n = __n - 1;
                          pfVar4 = (float *)((long)pfVar4 + 1);
                        }
                        puVar7 = (ulong *)flatcc_json_parser_array_end(ctx,buf,end,&local_94);
                      } while (local_94 != 0);
                      if (__n == 0) goto LAB_00116aed;
                    }
                    else {
                      local_94 = 0;
                      puVar7 = (ulong *)((long)puVar17 + 1);
                      if ((long)end - (long)puVar7 < 2) {
LAB_00116a3a:
                        puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                      }
                      else {
                        result = local_88;
                        if ((char)*(byte *)puVar7 < '!') {
                          if ((*(byte *)puVar7 != 0x20) ||
                             ((char)*(byte *)((long)puVar17 + 2) < '!')) goto LAB_00116a3a;
                          puVar7 = (ulong *)((long)puVar17 + 2);
                        }
                      }
LAB_00116674:
                      if (local_94 != 0) goto LAB_001166db;
                      __n = 3;
                      pfVar4 = local_48;
                    }
                    buf = (char *)puVar7;
                    if ((ctx->flags & 0x10) != 0) goto LAB_001170c2;
                  }
                }
                else {
                  if (0x7465737472ffffff < uVar5) {
                    if ((uVar5 & 0xffffffff00000000) == 0x7465787400000000) {
                      if (4 < (long)uVar9) {
                        bVar25 = *(byte *)((long)buf + 4);
                        if (ctx->unquoted == 0) {
                          if (bVar25 == 0x22) {
                            pbVar14 = (byte *)((long)buf + 5);
                            goto LAB_00116379;
                          }
                        }
                        else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                          pbVar14 = (byte *)((long)buf + 4);
                          ctx->unquoted = 0;
LAB_00116379:
                          if ((long)end - (long)pbVar14 < 2) {
LAB_001163d6:
                            pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                          }
                          else if ((char)*pbVar14 < '!') {
                            if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_001163d6;
                            pbVar14 = pbVar14 + 1;
                          }
                          if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                            puVar27 = (ulong *)flatcc_json_parser_set_error
                                                         (ctx,(char *)pbVar14,end,4);
                          }
                          else {
                            puVar27 = (ulong *)(pbVar14 + 1);
                            if ((long)end - (long)puVar27 < 2) {
LAB_00116cc4:
                              puVar27 = (ulong *)flatcc_json_parser_space_ext
                                                           (ctx,(char *)puVar27,end);
                            }
                            else {
                              result = local_88;
                              if ((char)(byte)*puVar27 < '!') {
                                if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                                goto LAB_00116cc4;
                                puVar27 = (ulong *)(pbVar14 + 2);
                              }
                            }
                          }
                        }
                      }
                      if ((ulong *)buf == puVar27) goto switchD_00115fe6_default;
                      puVar7 = (ulong *)flatcc_json_parser_char_array
                                                  (ctx,(char *)puVar27,end,base,5);
                      goto LAB_00116aed;
                    }
                    if ((uVar5 & 0xffffffffff000000) != 0x7465737473000000)
                    goto switchD_00115fe6_default;
                    if (5 < (long)uVar9) {
                      bVar25 = *(byte *)((long)buf + 5);
                      if (ctx->unquoted == 0) {
                        if (bVar25 == 0x22) {
                          pbVar14 = (byte *)((long)buf + 6);
                          goto LAB_00116451;
                        }
                      }
                      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                        pbVar14 = (byte *)((long)buf + 5);
                        ctx->unquoted = 0;
LAB_00116451:
                        if ((long)end - (long)pbVar14 < 2) {
LAB_0011646f:
                          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                        }
                        else if ((char)*pbVar14 < '!') {
                          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_0011646f;
                          pbVar14 = pbVar14 + 1;
                        }
                        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4)
                          ;
                          result = local_88;
                        }
                        else {
                          puVar27 = (ulong *)(pbVar14 + 1);
                          if ((long)end - (long)puVar27 < 2) {
LAB_001164bf:
                            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end)
                            ;
                            result = local_88;
                          }
                          else {
                            result = local_88;
                            if ((char)(byte)*puVar27 < '!') {
                              if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                              goto LAB_001164bf;
                              puVar27 = (ulong *)(pbVar14 + 2);
                            }
                          }
                        }
                      }
                    }
                    if ((ulong *)buf == puVar27) goto switchD_00115fe6_default;
                    if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5b)) {
                      local_94 = 0;
                      puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar27,end,0x16);
                      goto LAB_00116526;
                    }
                    buf = (char *)((long)puVar27 + 1);
                    if ((long)end - (long)buf < 2) {
LAB_0011653c:
                      buf = flatcc_json_parser_space_ext(ctx,buf,end);
                    }
                    else if (*buf < '!') {
                      if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!'))
                      goto LAB_0011653c;
                      buf = (char *)((long)puVar27 + 2);
                    }
                    result = local_88;
                    if ((buf == end) || ((byte)*(ulong *)buf != 0x5d)) {
                      local_94 = 1;
                    }
                    else {
                      local_94 = 0;
                      puVar7 = (ulong *)((long)buf + 1);
                      if ((long)end - (long)puVar7 < 2) {
LAB_00116a09:
                        puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                        result = local_88;
                      }
                      else if ((char)*(byte *)puVar7 < '!') {
                        if ((*(byte *)puVar7 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
                        goto LAB_00116a09;
                        puVar7 = (ulong *)((long)buf + 2);
                      }
LAB_00116526:
                      buf = (char *)puVar7;
                      if (local_94 == 0) {
                        lVar15 = 2;
                        pfVar4 = local_50;
                        goto LAB_001169f2;
                      }
                    }
                    lVar15 = 2;
                    pfVar4 = local_50;
                    do {
                      if (lVar15 == 0) {
                        if ((ctx->flags & 8) == 0) goto LAB_001170b5;
                        lVar15 = 0;
                      }
                      else {
                        buf = MyGame_Example_Test_parse_json_struct_inline(ctx,buf,end,pfVar4);
                        lVar15 = lVar15 + -1;
                        pfVar4 = pfVar4 + 1;
                      }
                      puVar7 = (ulong *)flatcc_json_parser_array_end(ctx,buf,end,&local_94);
                      buf = (char *)puVar7;
                    } while (local_94 != 0);
LAB_001169e9:
                    if (lVar15 != 0) goto LAB_001169f2;
                    goto LAB_00116aed;
                  }
                  if ((uVar5 & 0x7fffff0000000000) != 0x666f6f0000000000)
                  goto switchD_00115fe6_default;
                  if (3 < (long)uVar9) {
                    bVar25 = *(byte *)((long)buf + 3);
                    if (ctx->unquoted == 0) {
                      if (bVar25 == 0x22) {
                        pbVar14 = (byte *)((long)buf + 4);
                        goto LAB_0011634b;
                      }
                    }
                    else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                      pbVar14 = (byte *)((long)buf + 3);
                      ctx->unquoted = 0;
LAB_0011634b:
                      if ((long)end - (long)pbVar14 < 2) {
LAB_00116397:
                        pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                      }
                      else if ((char)*pbVar14 < '!') {
                        if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00116397;
                        pbVar14 = pbVar14 + 1;
                      }
                      if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                        puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
                      }
                      else {
                        puVar27 = (ulong *)(pbVar14 + 1);
                        if ((long)end - (long)puVar27 < 2) {
LAB_00116a89:
                          puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
                        }
                        else {
                          result = local_88;
                          if ((char)(byte)*puVar27 < '!') {
                            if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                            goto LAB_00116a89;
                            puVar27 = (ulong *)(pbVar14 + 2);
                          }
                        }
                      }
                    }
                  }
                  if ((ulong *)buf == puVar27) goto switchD_00115fe6_default;
                  if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5b)) {
                    local_94 = 0;
                    puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar27,end,0x16);
                    goto LAB_00116b38;
                  }
                  puVar17 = (ulong *)((long)puVar27 + 1);
                  if ((long)end - (long)puVar17 < 2) {
LAB_00116b53:
                    puVar17 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar17,end);
                  }
                  else if ((char)*(byte *)puVar17 < '!') {
                    if ((*(byte *)puVar17 != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!'))
                    goto LAB_00116b53;
                    puVar17 = (ulong *)((long)puVar27 + 2);
                  }
                  if ((puVar17 == (ulong *)end) || ((byte)*puVar17 != 0x5d)) {
                    local_94 = 1;
                    puVar7 = puVar17;
LAB_00116bbb:
                    lVar15 = 0x10;
                    local_60 = local_68;
                    do {
                      _val = _val & 0xffffffff00000000;
                      buf = flatcc_json_parser_float(ctx,(char *)puVar7,end,&val);
                      if ((puVar7 == (ulong *)buf) &&
                         ((buf = flatcc_json_parser_symbolic_float
                                           (ctx,buf,end,
                                            (flatcc_json_parser_integral_symbol_f **)
                                            MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_218
                                            ,&val), (ulong *)buf == puVar7 || (buf == end))))
                      goto LAB_00117041;
                      if (lVar15 == 0) {
                        if ((ctx->flags & 8) == 0) goto LAB_001170b5;
                        lVar15 = 0;
                      }
                      else {
                        *local_60 = val;
                        lVar15 = lVar15 + -1;
                        local_60 = local_60 + 1;
                      }
                      puVar7 = (ulong *)flatcc_json_parser_array_end(ctx,buf,end,&local_94);
                    } while (local_94 != 0);
                    pfVar4 = local_60;
                    if (lVar15 == 0) goto LAB_00116aed;
                  }
                  else {
                    local_94 = 0;
                    puVar7 = (ulong *)((long)puVar17 + 1);
                    if ((long)end - (long)puVar7 < 2) {
LAB_00116c93:
                      puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                      result = local_88;
                    }
                    else {
                      result = local_88;
                      if ((char)*(byte *)puVar7 < '!') {
                        if ((*(byte *)puVar7 != 0x20) || ((char)*(byte *)((long)puVar17 + 2) < '!'))
                        goto LAB_00116c93;
                        puVar7 = (ulong *)((long)puVar17 + 2);
                      }
                    }
LAB_00116b38:
                    if (local_94 != 0) goto LAB_00116bbb;
                    lVar15 = 0x10;
                    pfVar4 = local_68;
                  }
                  buf = (char *)puVar7;
                  if ((ctx->flags & 0x10) != 0) {
LAB_001170c2:
                    iVar1 = 0x21;
                    goto LAB_00115e24;
                  }
                  __n = lVar15 << 2;
                }
                memset(pfVar4,0,__n);
              }
LAB_00116aed:
              buf = flatcc_json_parser_object_end(ctx,(char *)puVar7,end,&local_94);
            } while (local_94 != 0);
          }
          else {
            buf = (char *)((long)puVar27 + 1);
            if ((long)end - (long)buf < 2) {
LAB_00117097:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if (*buf < '!') {
              if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!')) goto LAB_00117097;
              buf = (char *)((long)puVar27 + 2);
            }
          }
          goto LAB_00116f79;
        }
        iVar1 = 0x15;
        goto LAB_00115e24;
      }
      goto LAB_001146a9;
    }
    if (uVar26 == 0x6d616e79616e795f) {
      puVar7 = puVar27 + 1;
      uVar9 = (long)end - (long)puVar7;
      buf = (char *)puVar7;
      if (uVar9 < 8) {
        uVar12 = 0;
        uVar6 = 0;
        uVar16 = 0;
        uVar21 = 0;
        uVar26 = 0;
        uVar5 = 0;
        switch(uVar9) {
        case 7:
          uVar12 = (long)(char)*(byte *)((long)puVar27 + 0xe) << 8;
        case 6:
          uVar6 = (long)(char)*(byte *)((long)puVar27 + 0xd) << 0x10 | uVar12;
        case 5:
          uVar16 = (long)(char)*(byte *)((long)puVar27 + 0xc) << 0x18 | uVar6;
        case 4:
          uVar21 = (long)(char)*(byte *)((long)puVar27 + 0xb) << 0x20 | uVar16;
        case 3:
          uVar26 = (long)(char)*(byte *)((long)puVar27 + 10) << 0x28 | uVar21;
        case 2:
          uVar5 = (long)(char)*(byte *)((long)puVar27 + 9) << 0x30 | uVar26;
        case 1:
          uVar5 = (ulong)(byte)*puVar7 << 0x38 | uVar5;
          break;
        default:
          goto switchD_00114b15_default;
        }
      }
      else {
        uVar6 = *puVar7;
        uVar5 = (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
      }
      if (((uVar5 & 0xffffffff00000000) == 0x7479706500000000) && (4 < (long)uVar9)) {
        bVar25 = *(byte *)((long)puVar27 + 0xc);
        if (ctx->unquoted == 0) {
          if (bVar25 == 0x22) {
            pbVar14 = (byte *)((long)puVar27 + 0xd);
            goto LAB_00114f4c;
          }
        }
        else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
          pbVar14 = (byte *)((long)puVar27 + 0xc);
          ctx->unquoted = 0;
LAB_00114f4c:
          if ((long)end - (long)pbVar14 < 2) {
LAB_00115121:
            pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
          }
          else if ((char)*pbVar14 < '!') {
            if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00115121;
            pbVar14 = pbVar14 + 1;
          }
          if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
            buf = flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
          }
          else {
            buf = (char *)(pbVar14 + 1);
            if ((long)end - (long)buf < 2) {
LAB_00115e2e:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if ((char)(byte)*(ulong *)buf < '!') {
              if (((byte)*(ulong *)buf != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_00115e2e;
              buf = (char *)(pbVar14 + 2);
            }
          }
          if (puVar7 != (ulong *)buf) {
            buf = flatcc_json_parser_union_type_vector
                            (ctx,buf,end,0,3,h_unions,
                             MyGame_Example_Alt_parse_json_table::symbolic_parsers,
                             MyGame_Example_Any_parse_json_union,
                             MyGame_Example_Any_json_union_accept_type);
            goto LAB_00116f79;
          }
        }
      }
    }
    else {
      puVar7 = puVar27;
      if ((uVar26 & 0x7fffffffffffff00) == 0x6d616e79616e7900) {
        if (7 < (long)uVar9) {
          bVar25 = *(byte *)((long)puVar27 + 7);
          if (ctx->unquoted == 0) {
            if (bVar25 == 0x22) {
              puVar17 = puVar27 + 1;
              goto LAB_00114ed1;
            }
          }
          else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
            puVar17 = (ulong *)((long)puVar27 + 7);
            ctx->unquoted = 0;
LAB_00114ed1:
            if ((long)end - (long)puVar17 < 2) {
LAB_00115032:
              puVar17 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar17,end);
            }
            else if ((char)(byte)*puVar17 < '!') {
              if (((byte)*puVar17 != 0x20) || ((char)*(byte *)((long)puVar17 + 1) < '!'))
              goto LAB_00115032;
              puVar17 = (ulong *)((long)puVar17 + 1);
            }
            if ((puVar17 == (ulong *)end) || ((byte)*puVar17 != 0x3a)) {
              puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar17,end,4);
            }
            else {
              puVar7 = (ulong *)((long)puVar17 + 1);
              if ((long)end - (long)puVar7 < 2) {
LAB_00115c50:
                puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
              }
              else if ((char)*(byte *)puVar7 < '!') {
                if ((*(byte *)puVar7 != 0x20) || ((char)*(byte *)((long)puVar17 + 2) < '!'))
                goto LAB_00115c50;
                puVar7 = (ulong *)((long)puVar17 + 2);
              }
            }
          }
        }
        if (puVar27 != puVar7) {
          buf = flatcc_json_parser_union_vector
                          (ctx,(char *)puVar7,end,0,3,h_unions,MyGame_Example_Any_parse_json_union);
          goto LAB_00116f79;
        }
      }
      buf = (char *)puVar7;
      if ((uVar26 & 0x7fffffffff000000) == 0x6d6f766965000000) {
        if (5 < (long)end - (long)puVar7) {
          bVar25 = *(byte *)((long)puVar7 + 5);
          if (ctx->unquoted == 0) {
            if (bVar25 == 0x22) {
              pbVar14 = (byte *)((long)puVar7 + 6);
              goto LAB_00115d0c;
            }
          }
          else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
            pbVar14 = (byte *)((long)puVar7 + 5);
            ctx->unquoted = 0;
LAB_00115d0c:
            if ((long)end - (long)pbVar14 < 2) {
LAB_00115d2a:
              pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
            }
            else if ((char)*pbVar14 < '!') {
              if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00115d2a;
              pbVar14 = pbVar14 + 1;
            }
            if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
              buf = flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
            }
            else {
              buf = (char *)(pbVar14 + 1);
              if ((long)end - (long)buf < 2) {
LAB_00115e9f:
                buf = flatcc_json_parser_space_ext(ctx,buf,end);
              }
              else if ((char)(byte)*(ulong *)buf < '!') {
                if (((byte)*(ulong *)buf != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_00115e9f;
                buf = (char *)(pbVar14 + 2);
              }
            }
          }
        }
        if (puVar7 != (ulong *)buf) {
          buf = Fantasy_Movie_parse_json_table(ctx,buf,end,&ref);
          if (ref != 0) {
            pfVar20 = ctx->ctx;
            iVar1 = 1;
            goto LAB_00117134;
          }
          goto LAB_001146a9;
        }
      }
    }
switchD_00114b15_default:
    buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
    goto LAB_00116f79;
  }
  puVar7 = puVar27;
  if (0x707265666977ffff < uVar26) {
    if (uVar26 < 0x726170756e7a656c) {
      if ((uVar26 & 0x7fffffffffff0000) != 0x7072656669780000) goto switchD_00114b15_default;
      if (6 < (long)uVar9) {
        bVar25 = *(byte *)((long)puVar27 + 6);
        if (ctx->unquoted == 0) {
          if (bVar25 == 0x22) {
            pbVar14 = (byte *)((long)puVar27 + 7);
            goto LAB_00114e50;
          }
        }
        else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
          pbVar14 = (byte *)((long)puVar27 + 6);
          ctx->unquoted = 0;
LAB_00114e50:
          if ((long)end - (long)pbVar14 < 2) {
LAB_00114f7e:
            pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
          }
          else if ((char)*pbVar14 < '!') {
            if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00114f7e;
            pbVar14 = pbVar14 + 1;
          }
          if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
            buf = flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
          }
          else {
            buf = (char *)(pbVar14 + 1);
            if ((long)end - (long)buf < 2) {
LAB_001153dc:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if ((char)(byte)*(ulong *)buf < '!') {
              if (((byte)*(ulong *)buf != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_001153dc;
              buf = (char *)(pbVar14 + 2);
            }
          }
        }
      }
      if (puVar27 == (ulong *)buf) goto switchD_00114b15_default;
      buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx,buf,end,&ref);
      if (ref != 0) {
        pfVar20 = ctx->ctx;
        iVar1 = 0;
LAB_00117134:
        pfVar8 = flatcc_builder_table_add_offset(pfVar20,iVar1);
        if (pfVar8 != (flatcc_builder_ref_t *)0x0) {
          *pfVar8 = ref;
          goto LAB_00116f79;
        }
      }
      goto LAB_001146a9;
    }
    if (uVar26 == 0x726170756e7a656c) {
      puVar7 = puVar27 + 1;
      uVar9 = (long)end - (long)puVar7;
      buf = (char *)puVar7;
      if (uVar9 < 8) {
        bVar13 = 0;
        bVar11 = 0;
        bVar18 = 0;
        bVar22 = 0;
        bVar24 = 0;
        bVar25 = 0;
        switch(uVar9) {
        case 7:
          bVar13 = (char)*(byte *)((long)puVar27 + 0xe) >> 7;
        case 6:
          bVar11 = (char)*(byte *)((long)puVar27 + 0xd) >> 7 | bVar13;
        case 5:
          bVar18 = (char)*(byte *)((long)puVar27 + 0xc) >> 7 | bVar11;
        case 4:
          bVar22 = (char)*(byte *)((long)puVar27 + 0xb) >> 7 | bVar18;
        case 3:
          bVar24 = (char)*(byte *)((long)puVar27 + 10) >> 7 | bVar22;
        case 2:
          bVar25 = (char)*(byte *)((long)puVar27 + 9) >> 7 | bVar24;
        case 1:
          bVar25 = (byte)*puVar7 | bVar25;
          break;
        default:
          goto switchD_00114b15_default;
        }
      }
      else {
        bVar25 = (byte)*puVar7;
      }
      if ((bVar25 == 0x73) && (1 < (long)uVar9)) {
        bVar25 = *(byte *)((long)puVar27 + 9);
        if (ctx->unquoted == 0) {
          if (bVar25 != 0x22) goto switchD_00114b15_default;
          pbVar14 = (byte *)((long)puVar27 + 10);
LAB_001152c0:
          if ((long)end - (long)pbVar14 < 2) {
LAB_0011536d:
            pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
          }
          else if ((char)*pbVar14 < '!') {
            if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_0011536d;
            pbVar14 = pbVar14 + 1;
          }
          if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
            buf = flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
          }
          else {
            buf = (char *)(pbVar14 + 1);
            if ((long)end - (long)buf < 2) {
LAB_00116edc:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if ((char)(byte)*(ulong *)buf < '!') {
              if (((byte)*(ulong *)buf != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_00116edc;
              buf = (char *)(pbVar14 + 2);
            }
          }
          if (puVar7 != (ulong *)buf) {
            iVar1 = flatcc_builder_start_vector(ctx->ctx,8,4,0x1fffffff);
            if (iVar1 == 0) {
              if ((buf == end) || ((byte)*(ulong *)buf != 0x5b)) {
                more = 0;
                buf = flatcc_json_parser_set_error(ctx,buf,end,0x16);
              }
              else {
                puVar27 = (ulong *)((long)buf + 1);
                if ((long)end - (long)puVar27 < 2) {
LAB_00116fde:
                  puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
                }
                else if ((char)*(byte *)puVar27 < '!') {
                  if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
                  goto LAB_00116fde;
                  puVar27 = (ulong *)((long)buf + 2);
                }
                if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5d)) {
                  more = 1;
                  goto LAB_001170db;
                }
                more = 0;
                buf = (char *)((long)puVar27 + 1);
                if ((long)end - (long)buf < 2) {
LAB_00117073:
                  buf = flatcc_json_parser_space_ext(ctx,buf,end);
                }
                else if (*buf < '!') {
                  if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!'))
                  goto LAB_00117073;
                  buf = (char *)((long)puVar27 + 2);
                }
              }
              while (puVar27 = (ulong *)buf, more != 0) {
LAB_001170db:
                struct_base = flatcc_builder_extend_vector(ctx->ctx,1);
                buf = (char *)puVar27;
                if (struct_base == (void *)0x0) goto LAB_001146a9;
                pcVar3 = Fantasy_Rapunzel_parse_json_struct_inline
                                   (ctx,(char *)puVar27,end,struct_base);
                buf = flatcc_json_parser_array_end(ctx,pcVar3,end,&more);
              }
              ref = flatcc_builder_end_vector(ctx->ctx);
              if (ref != 0) {
                pfVar20 = ctx->ctx;
                iVar1 = 5;
                goto LAB_00117134;
              }
            }
            goto LAB_001146a9;
          }
        }
        else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
          pbVar14 = (byte *)((long)puVar27 + 9);
          ctx->unquoted = 0;
          goto LAB_001152c0;
        }
      }
    }
    else if (uVar26 >> 8 == 0x73616d706c6573) {
      if (7 < (long)uVar9) {
        bVar25 = *(byte *)((long)puVar27 + 7);
        if (ctx->unquoted == 0) {
          if (bVar25 == 0x22) {
            puVar17 = puVar27 + 1;
            goto LAB_00115296;
          }
        }
        else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
          puVar17 = (ulong *)((long)puVar27 + 7);
          ctx->unquoted = 0;
LAB_00115296:
          if ((long)end - (long)puVar17 < 2) {
LAB_001152f2:
            puVar17 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar17,end);
          }
          else if ((char)(byte)*puVar17 < '!') {
            if (((byte)*puVar17 != 0x20) || ((char)*(byte *)((long)puVar17 + 1) < '!'))
            goto LAB_001152f2;
            puVar17 = (ulong *)((long)puVar17 + 1);
          }
          if ((puVar17 == (ulong *)end) || ((byte)*puVar17 != 0x3a)) {
            puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar17,end,4);
          }
          else {
            puVar7 = (ulong *)((long)puVar17 + 1);
            if ((long)end - (long)puVar7 < 2) {
LAB_00116d00:
              puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
            }
            else if ((char)*(byte *)puVar7 < '!') {
              if ((*(byte *)puVar7 != 0x20) || ((char)*(byte *)((long)puVar17 + 2) < '!'))
              goto LAB_00116d00;
              puVar7 = (ulong *)((long)puVar17 + 2);
            }
          }
        }
      }
      if (puVar27 == puVar7) goto LAB_00116d68;
      iVar1 = flatcc_builder_start_vector(ctx->ctx,4,4,0x3fffffff);
      buf = (char *)puVar7;
      if (iVar1 == 0) {
        if ((puVar7 == (ulong *)end) || ((byte)*puVar7 != 0x5b)) {
          more = 0;
          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar7,end,0x16);
        }
        else {
          buf = (char *)((long)puVar7 + 1);
          if ((long)end - (long)buf < 2) {
LAB_00116db0:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar7 + 2) < '!')) goto LAB_00116db0;
            buf = (char *)((long)puVar7 + 2);
          }
          if ((buf == end) || ((byte)*(ulong *)buf != 0x5d)) {
            more = 1;
            goto LAB_00116e16;
          }
          more = 0;
          puVar27 = (ulong *)((long)buf + 1);
          if ((long)end - (long)puVar27 < 2) {
LAB_00116fc8:
            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
          }
          else if ((char)*(byte *)puVar27 < '!') {
            if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
            goto LAB_00116fc8;
            puVar27 = (ulong *)((long)buf + 2);
          }
        }
        while (buf = (char *)puVar27, more != 0) {
LAB_00116e16:
          _val = _val & 0xffffffff00000000;
          pfVar4 = (float *)flatcc_builder_extend_vector(ctx->ctx,1);
          if (pfVar4 == (float *)0x0) goto LAB_001146a9;
          puVar27 = (ulong *)flatcc_json_parser_float(ctx,buf,end,&val);
          if (((ulong *)buf == puVar27) &&
             ((puVar27 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)puVar27,end,
                                             MyGame_Example_Alt_parse_json_table::symbolic_parsers_1
                                             ,&val), bVar28 = puVar27 == (ulong *)buf,
              buf = (char *)puVar27, bVar28 || (puVar27 == (ulong *)end)))) goto LAB_001146a9;
          *pfVar4 = val;
          puVar27 = (ulong *)flatcc_json_parser_array_end(ctx,(char *)puVar27,end,&more);
          result = local_88;
        }
        ref = flatcc_builder_end_vector(ctx->ctx);
        if (ref != 0) {
          pfVar20 = ctx->ctx;
          iVar1 = 7;
          goto LAB_00117134;
        }
      }
      goto LAB_001146a9;
    }
    goto switchD_00114b15_default;
  }
  if ((uVar26 & 0x7fffffffff000000) == 0x6e616d6573000000) {
    if (5 < (long)uVar9) {
      bVar25 = *(byte *)((long)puVar27 + 5);
      if (ctx->unquoted == 0) {
        if (bVar25 == 0x22) {
          pbVar14 = (byte *)((long)puVar27 + 6);
          goto LAB_00114dba;
        }
      }
      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
        pbVar14 = (byte *)((long)puVar27 + 5);
        ctx->unquoted = 0;
LAB_00114dba:
        if ((long)end - (long)pbVar14 < 2) {
LAB_00114dd8:
          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
        }
        else if ((char)*pbVar14 < '!') {
          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00114dd8;
          pbVar14 = pbVar14 + 1;
        }
        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
          puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
        }
        else {
          puVar7 = (ulong *)(pbVar14 + 1);
          if ((long)end - (long)puVar7 < 2) {
LAB_001151a6:
            puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
          }
          else if ((char)(byte)*puVar7 < '!') {
            if (((byte)*puVar7 != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_001151a6;
            puVar7 = (ulong *)(pbVar14 + 2);
          }
        }
      }
    }
    if (puVar27 != puVar7) {
      iVar1 = flatcc_builder_start_offset_vector(ctx->ctx);
      buf = (char *)puVar7;
      if (iVar1 == 0) {
        if ((puVar7 == (ulong *)end) || ((byte)*puVar7 != 0x5b)) {
          more = 0;
          buf = flatcc_json_parser_set_error(ctx,(char *)puVar7,end,0x16);
        }
        else {
          puVar27 = (ulong *)((long)puVar7 + 1);
          if ((long)end - (long)puVar27 < 2) {
LAB_00115222:
            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
          }
          else if ((char)*(byte *)puVar27 < '!') {
            if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)puVar7 + 2) < '!'))
            goto LAB_00115222;
            puVar27 = (ulong *)((long)puVar7 + 2);
          }
          if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x5d)) {
            more = 1;
            goto LAB_00117156;
          }
          more = 0;
          buf = (char *)((long)puVar27 + 1);
          if ((long)end - (long)buf < 2) {
LAB_0011535a:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!')) goto LAB_0011535a;
            buf = (char *)((long)puVar27 + 2);
          }
        }
        while (puVar27 = (ulong *)buf, more != 0) {
LAB_00117156:
          buf = flatcc_json_parser_build_string(ctx,(char *)puVar27,end,&ref);
          if ((ref == 0) ||
             (pfVar8 = flatcc_builder_extend_offset_vector(ctx->ctx,1),
             pfVar8 == (flatcc_builder_ref_t *)0x0)) goto LAB_001146a9;
          *pfVar8 = ref;
          buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
        }
        ref = flatcc_builder_end_offset_vector(ctx->ctx);
        if ((ref != 0) &&
           (pfVar8 = flatcc_builder_table_add_offset(ctx->ctx,6),
           pfVar8 != (flatcc_builder_ref_t *)0x0)) {
          *pfVar8 = ref;
          goto LAB_00116f79;
        }
      }
      goto LAB_001146a9;
    }
  }
  else {
    if ((uVar26 & 0x7fffffffffff0000) != 0x6d756c74696b0000) goto switchD_00114b15_default;
    if (6 < (long)uVar9) {
      bVar25 = *(byte *)((long)puVar27 + 6);
      if (ctx->unquoted == 0) {
        if (bVar25 == 0x22) {
          pbVar14 = (byte *)((long)puVar27 + 7);
          goto LAB_00114e90;
        }
      }
      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
        pbVar14 = (byte *)((long)puVar27 + 6);
        ctx->unquoted = 0;
LAB_00114e90:
        if ((long)end - (long)pbVar14 < 2) {
LAB_00114fd7:
          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
        }
        else if ((char)*pbVar14 < '!') {
          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00114fd7;
          pbVar14 = pbVar14 + 1;
        }
        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
          puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
        }
        else {
          puVar7 = (ulong *)(pbVar14 + 1);
          if ((long)end - (long)puVar7 < 2) {
LAB_0011541e:
            puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
          }
          else if ((char)(byte)*puVar7 < '!') {
            if (((byte)*puVar7 != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_0011541e;
            puVar7 = (ulong *)(pbVar14 + 2);
          }
        }
      }
    }
    if (puVar27 != puVar7) {
      iVar1 = flatcc_builder_start_offset_vector(ctx->ctx);
      buf = (char *)puVar7;
      if (iVar1 == 0) {
        if ((puVar7 == (ulong *)end) || ((byte)*puVar7 != 0x5b)) {
          more = 0;
          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar7,end,0x16);
        }
        else {
          buf = (char *)((long)puVar7 + 1);
          if ((long)end - (long)buf < 2) {
LAB_001154cd:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar7 + 2) < '!')) goto LAB_001154cd;
            buf = (char *)((long)puVar7 + 2);
          }
          if ((buf == end) || ((byte)*(ulong *)buf != 0x5d)) {
            more = 1;
            goto LAB_00115533;
          }
          more = 0;
          puVar27 = (ulong *)((long)buf + 1);
          if ((long)end - (long)puVar27 < 2) {
LAB_00115e89:
            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
          }
          else if ((char)*(byte *)puVar27 < '!') {
            if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
            goto LAB_00115e89;
            puVar27 = (ulong *)((long)buf + 2);
          }
        }
        while (buf = (char *)puVar27, more != 0) {
LAB_00115533:
          ref = 0;
          iVar1 = flatcc_builder_start_table(ctx->ctx,3);
          if (iVar1 == 0) {
            if ((buf == end) || ((byte)*(ulong *)buf != 0x7b)) {
              more_1 = 0;
              buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
              goto LAB_001155b0;
            }
            puVar27 = (ulong *)((long)buf + 1);
            if ((long)end - (long)puVar27 < 2) {
LAB_00115636:
              puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
            }
            else if ((char)*(byte *)puVar27 < '!') {
              if ((*(byte *)puVar27 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
              goto LAB_00115636;
              puVar27 = (ulong *)((long)buf + 2);
            }
            if ((puVar27 == (ulong *)end) || ((byte)*puVar27 != 0x7d)) {
              more_1 = 1;
              buf = (char *)puVar27;
LAB_00115688:
              if (buf != end) {
                if ((byte)*(ulong *)buf == 0x2e) {
                  buf = flatcc_json_parser_set_error(ctx,buf,end,5);
                }
                else if ((byte)*(ulong *)buf == 0x22) {
                  buf = (char *)((long)buf + 1);
                  ctx->unquoted = 0;
                }
                else {
                  ctx->unquoted = 1;
                }
              }
              uVar9 = (long)end - (long)buf;
              puVar27 = (ulong *)buf;
              if (uVar9 < 8) {
                uVar12 = 0;
                uVar6 = 0;
                uVar16 = 0;
                uVar21 = 0;
                uVar26 = 0;
                uVar5 = 0;
                switch(uVar9) {
                case 7:
                  uVar12 = (long)(char)*(byte *)((long)buf + 6) << 8;
                case 6:
                  uVar6 = (long)(char)*(byte *)((long)buf + 5) << 0x10 | uVar12;
                case 5:
                  uVar16 = (long)(char)*(byte *)((long)buf + 4) << 0x18 | uVar6;
                case 4:
                  uVar21 = (long)(char)*(byte *)((long)buf + 3) << 0x20 | uVar16;
                case 3:
                  uVar26 = (long)(char)*(byte *)((long)buf + 2) << 0x28 | uVar21;
                case 2:
                  uVar5 = (long)(char)*(byte *)((long)buf + 1) << 0x30 | uVar26;
                case 1:
                  uVar5 = (ulong)(byte)*(ulong *)buf << 0x38 | uVar5;
                  goto LAB_0011575c;
                }
              }
              else {
                uVar6 = *(ulong *)buf;
                uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                        (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                        (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                        (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
LAB_0011575c:
                if (0x68656c6c6effffff < uVar5) {
                  if ((uVar5 & 0xffffffffff000000) == 0x68656c6c6f000000) {
                    if (5 < (long)uVar9) {
                      bVar25 = *(byte *)((long)buf + 5);
                      if (ctx->unquoted == 0) {
                        if (bVar25 == 0x22) {
                          pbVar14 = (byte *)((long)buf + 6);
                          goto LAB_00115957;
                        }
                      }
                      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                        pbVar14 = (byte *)((long)buf + 5);
                        ctx->unquoted = 0;
LAB_00115957:
                        if ((long)end - (long)pbVar14 < 2) {
LAB_001159df:
                          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                        }
                        else if ((char)*pbVar14 < '!') {
                          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_001159df;
                          pbVar14 = pbVar14 + 1;
                        }
                        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4)
                          ;
                        }
                        else {
                          puVar27 = (ulong *)(pbVar14 + 1);
                          if ((long)end - (long)puVar27 < 2) {
LAB_00115ba8:
                            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end)
                            ;
                          }
                          else if ((char)(byte)*puVar27 < '!') {
                            if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                            goto LAB_00115ba8;
                            puVar27 = (ulong *)(pbVar14 + 2);
                          }
                        }
                      }
                    }
                    if ((ulong *)buf == puVar27) goto switchD_00115708_default;
                    buf = flatcc_json_parser_build_string(ctx,(char *)puVar27,end,&ref_1);
                    if (ref_1 == 0) goto LAB_001155ba;
                    pfVar20 = ctx->ctx;
                    iVar1 = 0;
                  }
                  else {
                    if ((uVar5 & 0xffffffffff000000) != 0x776f726c64000000)
                    goto switchD_00115708_default;
                    if (5 < (long)uVar9) {
                      bVar25 = *(byte *)((long)buf + 5);
                      if (ctx->unquoted == 0) {
                        if (bVar25 == 0x22) {
                          pbVar14 = (byte *)((long)buf + 6);
                          goto LAB_00115929;
                        }
                      }
                      else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                        pbVar14 = (byte *)((long)buf + 5);
                        ctx->unquoted = 0;
LAB_00115929:
                        if ((long)end - (long)pbVar14 < 2) {
LAB_00115979:
                          pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                        }
                        else if ((char)*pbVar14 < '!') {
                          if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_00115979;
                          pbVar14 = pbVar14 + 1;
                        }
                        if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                          puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4)
                          ;
                        }
                        else {
                          puVar27 = (ulong *)(pbVar14 + 1);
                          if ((long)end - (long)puVar27 < 2) {
LAB_00115b6a:
                            puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end)
                            ;
                          }
                          else if ((char)(byte)*puVar27 < '!') {
                            if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!'))
                            goto LAB_00115b6a;
                            puVar27 = (ulong *)(pbVar14 + 2);
                          }
                        }
                      }
                    }
                    if ((ulong *)buf == puVar27) goto switchD_00115708_default;
                    buf = flatcc_json_parser_build_string(ctx,(char *)puVar27,end,&ref_1);
                    if (ref_1 == 0) goto LAB_001155ba;
                    pfVar20 = ctx->ctx;
                    iVar1 = 1;
                  }
                  pfVar8 = flatcc_builder_table_add_offset(pfVar20,iVar1);
                  if (pfVar8 == (flatcc_builder_ref_t *)0x0) goto LAB_001155ba;
                  *pfVar8 = ref_1;
                  goto LAB_00115c08;
                }
                if ((uVar5 & 0x7fffffffffff0000) != 0x666f6f6261720000)
                goto switchD_00115708_default;
                if (6 < (long)uVar9) {
                  bVar25 = *(byte *)((long)buf + 6);
                  if (ctx->unquoted == 0) {
                    if (bVar25 == 0x22) {
                      pbVar14 = (byte *)((long)buf + 7);
                      goto LAB_00115893;
                    }
                  }
                  else if ((char)bVar25 < '!' || bVar25 == 0x3a) {
                    pbVar14 = (byte *)((long)buf + 6);
                    ctx->unquoted = 0;
LAB_00115893:
                    if ((long)end - (long)pbVar14 < 2) {
LAB_001158b1:
                      pbVar14 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar14,end);
                    }
                    else if ((char)*pbVar14 < '!') {
                      if ((*pbVar14 != 0x20) || ((char)pbVar14[1] < '!')) goto LAB_001158b1;
                      pbVar14 = pbVar14 + 1;
                    }
                    if ((pbVar14 == (byte *)end) || (*pbVar14 != 0x3a)) {
                      puVar27 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar14,end,4);
                    }
                    else {
                      puVar27 = (ulong *)(pbVar14 + 1);
                      if ((long)end - (long)puVar27 < 2) {
LAB_00115a45:
                        puVar27 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar27,end);
                      }
                      else if ((char)(byte)*puVar27 < '!') {
                        if (((byte)*puVar27 != 0x20) || ((char)pbVar14[2] < '!')) goto LAB_00115a45;
                        puVar27 = (ulong *)(pbVar14 + 2);
                      }
                    }
                  }
                }
                if ((ulong *)buf != puVar27) {
                  _val = 0;
                  local_94 = 0;
                  local_70 = 0;
                  buf = (char *)puVar27;
                  uVar9 = local_70;
                  if ((puVar27 != (ulong *)end) &&
                     (buf = flatcc_json_parser_integer
                                      (ctx,(char *)puVar27,end,&local_94,(uint64_t *)&val),
                     uVar9 = local_70, (ulong *)buf != puVar27)) {
                    if (local_94 == 0) {
                      uVar9 = _val;
                      if ((long)_val < 0) {
                        iVar1 = 7;
                        goto LAB_00115ae7;
                      }
                    }
                    else if (_val < 0x8000000000000001) {
                      uVar9 = -_val;
                    }
                    else {
                      iVar1 = 8;
LAB_00115ae7:
                      buf = flatcc_json_parser_set_error(ctx,buf,end,iVar1);
                      uVar9 = local_70;
                    }
                  }
                  local_70 = uVar9;
                  if ((puVar27 == (ulong *)buf) &&
                     ((buf = flatcc_json_parser_symbolic_int64
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_MultipleKeys_parse_json_table_symbolic_parsers
                                        ,(int64_t *)&local_70), (ulong *)buf == puVar27 ||
                      (buf == end)))) goto LAB_001155ba;
                  uVar9 = local_70;
                  if ((local_70 == 0) && ((ctx->flags & 2) == 0)) goto LAB_00115c08;
                  puVar27 = (ulong *)flatcc_builder_table_add(ctx->ctx,2,8,8);
                  if (puVar27 == (ulong *)0x0) goto LAB_001155ba;
                  *puVar27 = uVar9;
                  goto LAB_00115c08;
                }
              }
switchD_00115708_default:
              buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar27,end);
LAB_00115c08:
              buf = flatcc_json_parser_object_end(ctx,buf,end,&more_1);
              if (more_1 == 0) goto LAB_001155b0;
              goto LAB_00115688;
            }
            more_1 = 0;
            buf = (char *)((long)puVar27 + 1);
            if ((long)end - (long)buf < 2) {
LAB_00115c40:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if (*buf < '!') {
              if ((*buf != 0x20) || ((char)*(byte *)((long)puVar27 + 2) < '!')) goto LAB_00115c40;
              buf = (char *)((long)puVar27 + 2);
            }
LAB_001155b0:
            if ((ctx->error != 0) || (ref = flatcc_builder_end_table(ctx->ctx), ref == 0))
            goto LAB_001155ba;
          }
          else {
LAB_001155ba:
            buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
            if (ref == 0) goto LAB_001146a9;
          }
          pfVar8 = flatcc_builder_extend_offset_vector(ctx->ctx,1);
          if (pfVar8 == (flatcc_builder_ref_t *)0x0) goto LAB_001146a9;
          *pfVar8 = ref;
          puVar27 = (ulong *)flatcc_json_parser_array_end(ctx,buf,end,&more);
        }
        ref = flatcc_builder_end_offset_vector(ctx->ctx);
        if (ref != 0) {
          pfVar20 = ctx->ctx;
          iVar1 = 4;
          goto LAB_00117134;
        }
      }
      goto LAB_001146a9;
    }
  }
LAB_00116d68:
  buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar7,end);
  goto LAB_00116f79;
LAB_0011705b:
  iVar1 = 0x22;
  goto LAB_00117069;
LAB_00117041:
  iVar1 = 0x23;
LAB_00117069:
  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar1);
LAB_00116f79:
  puVar27 = (ulong *)flatcc_json_parser_object_end(ctx,buf,end,&more);
  buf = (char *)puVar27;
  pfVar8 = local_88;
  if (more == 0) goto LAB_0011473e;
  goto LAB_001147e6;
LAB_001170b5:
  iVar1 = 0x22;
LAB_00115e24:
  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar1);
  goto LAB_00116f79;
}

Assistant:

static const char *MyGame_Example_Alt_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 9)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 1, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6d756c74696b0000) { /* branch "multik" */
            if (w < 0x6d616e79616e7900) { /* branch "manyany" */
                if (w == 0x66697865645f6172) { /* descend "fixed_ar" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffff0000000000) == 0x7261790000000000) { /* "ray" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                        if (mark != buf) {
                            if (!(pval = flatcc_builder_table_add(ctx->ctx, 8, 124, 4))) goto failed;
                            buf = MyGame_Example_FooBar_parse_json_struct_inline(ctx, buf, end, pval);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "ray" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "ray" */
                } else { /* descend "fixed_ar" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "fixed_ar" */
            } else { /* branch "manyany" */
                if (w == 0x6d616e79616e795f) { /* descend "manyany_" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x7479706500000000) { /* "type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    MyGame_Example_Any_parse_json_enum,
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 0, 3, h_unions, symbolic_parsers, MyGame_Example_Any_parse_json_union, MyGame_Example_Any_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "type" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "type" */
                } else { /* descend "manyany_" */
                    if ((w & 0xffffffffffffff00) == 0x6d616e79616e7900) { /* "manyany" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union_vector(ctx, buf, end, 0, 3, h_unions, MyGame_Example_Any_parse_json_union);
                        } else {
                            goto pfguard1;
                        }
                    } else { /* "manyany" */
                        goto pfguard1;
                    } /* "manyany" */
                    goto endpfguard1;
pfguard1:
                    if ((w & 0xffffffffff000000) == 0x6d6f766965000000) { /* "movie" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = Fantasy_Movie_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "movie" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "movie" */
endpfguard1:
                    (void)0;
                } /* descend "manyany_" */
            } /* branch "manyany" */
        } else { /* branch "multik" */
            if (w < 0x7072656669780000) { /* branch "prefix" */
                if ((w & 0xffffffffff000000) == 0x6e616d6573000000) { /* "names" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        ref = flatcc_builder_end_offset_vector(ctx->ctx);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 6))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "names" */
                    if ((w & 0xffffffffffff0000) == 0x6d756c74696b0000) { /* "multik" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                            buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                            while (more) {
                                buf = MyGame_Example_MultipleKeys_parse_json_table(ctx, buf, end, &ref);
                                if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                                *pref = ref;
                                buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                            }
                            ref = flatcc_builder_end_offset_vector(ctx->ctx);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 4))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "multik" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "multik" */
                } /* "names" */
            } else { /* branch "prefix" */
                if (w < 0x726170756e7a656c) { /* branch "rapunzel" */
                    if ((w & 0xffffffffffff0000) == 0x7072656669780000) { /* "prefix" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "prefix" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "prefix" */
                } else { /* branch "rapunzel" */
                    if (w == 0x726170756e7a656c) { /* descend "rapunzel" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xff00000000000000) == 0x7300000000000000) { /* "s" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 8, 4, UINT64_C(536870911))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx, buf, end, pval);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 5))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "s" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "s" */
                    } else { /* descend "rapunzel" */
                        if ((w & 0xffffffffffffff00) == 0x73616d706c657300) { /* "samples" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 4, 4, UINT64_C(1073741823))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    float val = 0;
                                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                            monster_test_local_MyGame_Example_json_parser_enum,
                                            monster_test_global_json_parser_enum, 0 };
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                    if (mark == buf) {
                                        buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                        if (buf == mark || buf == end) goto failed;
                                    }
                                    flatbuffers_float_write_to_pe(pval, val);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 7))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "samples" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "samples" */
                    } /* descend "rapunzel" */
                } /* branch "rapunzel" */
            } /* branch "prefix" */
        } /* branch "multik" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}